

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O1

int32 mmi_accum_gauden(float32 ***denacc,uint32 *lcl2gbl,uint32 n_lcl2gbl,vector_t *frame,
                      uint32 ***den_idx,gauden_t *g,int32 mean_reest,int32 var_reest,
                      float64 arc_gamma,feat_t *fcb)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  vector_t ***ppppfVar4;
  vector_t ***ppppfVar5;
  float32 ***pppfVar6;
  vector_t pfVar7;
  vector_t pfVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  vector_t pfVar12;
  ulong uVar13;
  float fVar14;
  double dVar15;
  
  if (n_lcl2gbl != 0) {
    ppppfVar4 = g->l_macc;
    ppppfVar5 = g->l_vacc;
    pppfVar6 = g->l_dnom;
    uVar10 = 0;
    pfVar12 = (vector_t)0x0;
    do {
      if (g->n_feat != 0) {
        uVar11 = 0;
        do {
          if (g->n_top != 0) {
            pfVar7 = frame[uVar11];
            uVar13 = 0;
            do {
              uVar2 = den_idx[uVar10][uVar11][uVar13];
              fVar14 = (float)denacc[uVar10][uVar11][uVar2];
              dVar15 = exp((double)arc_gamma);
              fVar14 = (float)(dVar15 * (double)fVar14);
              if (1.2e-38 < fVar14) {
                if (var_reest != 0) {
                  pfVar12 = ppppfVar5[uVar10][uVar11][uVar2];
                }
                uVar3 = g->veclen[uVar11];
                if ((ulong)uVar3 != 0) {
                  pfVar8 = ppppfVar4[uVar10][uVar11][uVar2];
                  uVar9 = 0;
                  do {
                    if (mean_reest != 0) {
                      pfVar8[uVar9] = pfVar7[uVar9] * fVar14 + pfVar8[uVar9];
                    }
                    if (var_reest != 0) {
                      fVar1 = pfVar7[uVar9];
                      pfVar12[uVar9] = fVar1 * fVar14 * fVar1 + pfVar12[uVar9];
                    }
                    uVar9 = uVar9 + 1;
                  } while (uVar3 != uVar9);
                }
                pppfVar6[uVar10][uVar11][uVar2] =
                     (float32)(fVar14 + (float)pppfVar6[uVar10][uVar11][uVar2]);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 < g->n_top);
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < g->n_feat);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != n_lcl2gbl);
  }
  return 0;
}

Assistant:

int
mmi_accum_gauden(float32 ***denacc,
		 uint32 *lcl2gbl,
		 uint32 n_lcl2gbl,
		 vector_t *frame,
		 uint32 ***den_idx,
		 gauden_t *g,
		 int32 mean_reest,
		 int32 var_reest,
		 float64 arc_gamma,
		 feat_t *fcb)
{
  uint32 g_i, i, j, k, kk, l;
  
  vector_t ***macc = g->l_macc;     /* local to utt */
  vector_t m;
  
  vector_t ***vacc = g->l_vacc;
  vector_t v = NULL;
  
  float32 ***dnom = g->l_dnom;
  
  float32 obs_cnt;

  /* for each density family found in the utterance */
  for (i = 0; i < n_lcl2gbl; i++) {

    g_i = lcl2gbl[i];
    
    /* for each feature */
    for (j = 0; j < gauden_n_feat(g); j++) {
      vector_t feat = frame[j];
      
      /* for each density in the mixture density */
      for (kk = 0; kk < gauden_n_top(g); kk++) {
	
	k = den_idx[i][j][kk];                       /* i.e. density k is one of the n_top densities */
	
	obs_cnt = denacc[i][j][k] * exp(arc_gamma);  /* observation count for density (k) at this time frame
							given the model */
	
	/* don't bother adding a bunch of essentially zero values */
	if (obs_cnt <= MIN_POS_FLOAT32)
	  continue;
	
	m = macc[i][j][k];                          /* the vector accumulator for mean (i,j,k) */
	
	if (var_reest) {
	  v = vacc[i][j][k];                        /* the vector accumulator for variance (i,j,k) */
	}
	
	for (l = 0; l < g->veclen[j]; l++) {
	  if (mean_reest) {
	    m[l] += obs_cnt * feat[l];
	  }
	    
	  if (var_reest) {
	    v[l] += obs_cnt * feat[l] * feat[l];
	  }
	}
	/* accumulate observation count for all densities */
	dnom[i][j][k] += obs_cnt;
      }
    }
  }
  
  return S3_SUCCESS;
}